

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strspn.c
# Opt level: O0

size_t strspn(char *__s,char *__accept)

{
  char *local_30;
  char *p;
  size_t len;
  char *s2_local;
  char *s1_local;
  
  p = (char *)0x0;
  while( true ) {
    local_30 = __accept;
    if (__s[(long)p] == '\0') {
      return (size_t)p;
    }
    for (; (*local_30 != '\0' && (__s[(long)p] != *local_30)); local_30 = local_30 + 1) {
    }
    if (*local_30 == '\0') break;
    p = p + 1;
  }
  return (size_t)p;
}

Assistant:

size_t strspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[ len ] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p )
            {
                break;
            }

            ++p;
        }

        if ( ! *p )
        {
            return len;
        }

        ++len;
    }

    return len;
}